

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall demo::Logging::LogLine::LogLine(LogLine *this)

{
  ostringstream *this_00;
  long in_FS_OFFSET;
  string context;
  char *local_60;
  long local_58;
  char local_50 [16];
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  this->capture_ = *(Logging **)(in_FS_OFFSET + -0x10);
  this_00 = &this->output_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  Tracing::GetContext_abi_cxx11_();
  if (local_38 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"(unknown context): ",0x13);
  }
  else {
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_40,local_40 + local_38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_60,local_58);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,": ",2);
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

Logging::LogLine::LogLine() : capture_(GetCurrent()) {
  const std::string context = Tracing::GetContext();
  if (!context.empty()) {
    *this << context << ": ";
  } else {
    *this << "(unknown context): ";
  }
}